

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  ImGuiWindow *this;
  ImDrawList *this_00;
  undefined1 auVar1 [4];
  ImGuiContext *pIVar2;
  int y1;
  ImGuiID id_00;
  ImU32 col;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  ImGuiCol local_14c;
  ImVec2 *local_148;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_108;
  float local_100;
  byte local_f9;
  char *local_f8;
  ImRect local_e8;
  ImRect local_d8;
  undefined1 local_c8 [8];
  ImRect grab_rect;
  ImU32 grab_col;
  float scroll_v_norm;
  bool seek_absolute;
  float clicked_v_norm;
  float *click_delta_to_grab_center_v;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  float scroll_max;
  bool previously_held;
  bool hovered;
  float fStack_84;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  float win_size_v;
  float win_size_contents_v;
  float win_size_avail_v;
  float scroll_v;
  float scrollbar_size_v;
  uint local_64;
  undefined1 local_60 [4];
  int window_rounding_corners;
  ImRect bb;
  float border_size;
  ImRect window_rect;
  float other_scrollbar_size_w;
  bool other_scrollbar;
  ImGuiID id;
  ImGuiStyle *style;
  bool horizontal;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiLayoutType direction_local;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  bVar4 = direction != 1;
  if (bVar4) {
    local_f8 = "#SCROLLY";
  }
  else {
    local_f8 = "#SCROLLX";
  }
  id_00 = ImGuiWindow::GetID(this,local_f8,(char *)0x0);
  if (bVar4) {
    local_f9 = this->ScrollbarX;
  }
  else {
    local_f9 = this->ScrollbarY;
  }
  local_f9 = local_f9 & 1;
  if (local_f9 == 0) {
    local_100 = 0.0;
  }
  else {
    local_100 = (pIVar2->Style).ScrollbarSize;
  }
  join_0x00001240_0x00001200_ = ImGuiWindow::Rect(this);
  bb.Max.x = this->WindowBorderSize;
  if (bVar4) {
    ImRect::ImRect((ImRect *)local_60,window_rect.Min.x - (pIVar2->Style).ScrollbarSize,
                   (this->Pos).y + bb.Max.x,window_rect.Min.x - bb.Max.x,
                   (window_rect.Min.y - local_100) - bb.Max.x);
    fVar6 = ImGuiWindow::TitleBarHeight(this);
    if ((this->Flags & 0x400U) == 0) {
      local_108 = 0.0;
    }
    else {
      local_108 = ImGuiWindow::MenuBarHeight(this);
    }
    window_rounding_corners = (int)(fVar6 + local_108 + (float)window_rounding_corners);
  }
  else {
    ImRect::ImRect((ImRect *)local_60,(this->Pos).x + bb.Max.x,
                   window_rect.Min.y - (pIVar2->Style).ScrollbarSize,
                   (window_rect.Min.x - local_100) - bb.Max.x,window_rect.Min.y - bb.Max.x);
  }
  fVar6 = ImRect::GetWidth((ImRect *)local_60);
  if ((0.0 < fVar6) && (fVar6 = ImRect::GetHeight((ImRect *)local_60), 0.0 < fVar6)) {
    if (bVar4) {
      bVar5 = false;
      if ((this->Flags & 1U) != 0) {
        bVar5 = (this->Flags & 0x400U) == 0;
      }
      local_64 = 0;
      if (bVar5) {
        local_64 = 2;
      }
      uVar3 = 8;
      if (local_f9 != 0) {
        uVar3 = 0;
      }
      local_64 = local_64 | uVar3;
    }
    else {
      local_64 = 8;
      if (local_f9 != 0) {
        local_64 = 0;
      }
      local_64 = local_64 | 4;
    }
    this_00 = this->DrawList;
    col = GetColorU32(0xe,1.0);
    ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_60,&bb.Min,col,this->WindowRounding,local_64);
    fVar6 = ImClamp<float>((float)(int)(((bb.Min.x - (float)local_60) - 2.0) * 0.5),0.0,3.0);
    fVar7 = ImClamp<float>((float)(int)(((bb.Min.y - (float)window_rounding_corners) - 2.0) * 0.5),
                           0.0,3.0);
    ImVec2::ImVec2((ImVec2 *)&scroll_v,-fVar6,-fVar7);
    ImRect::Expand((ImRect *)local_60,(ImVec2 *)&scroll_v);
    if (bVar4) {
      local_12c = ImRect::GetHeight((ImRect *)local_60);
    }
    else {
      local_12c = ImRect::GetWidth((ImRect *)local_60);
    }
    win_size_avail_v = local_12c;
    if (bVar4) {
      local_130 = (this->Scroll).y;
    }
    else {
      local_130 = (this->Scroll).x;
    }
    win_size_contents_v = local_130;
    if (bVar4) {
      local_134 = (this->SizeFull).y;
    }
    else {
      local_134 = (this->SizeFull).x;
    }
    win_size_v = local_134 - local_100;
    if (bVar4) {
      local_138 = (this->SizeContents).y;
    }
    else {
      local_138 = (this->SizeContents).x;
    }
    grab_h_pixels = local_138;
    fVar6 = ImMax<float>(local_138,win_size_v);
    if (fVar6 <= 0.0) {
      __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1939,"void ImGui::Scrollbar(ImGuiLayoutType)");
    }
    fVar6 = ImMax<float>(grab_h_pixels,win_size_v);
    grab_h_norm = ImMax<float>(fVar6,1.0);
    fStack_84 = ImClamp<float>(win_size_avail_v * (win_size_v / grab_h_norm),
                               (pIVar2->Style).GrabMinSize,win_size_avail_v);
    scroll_max = fStack_84 / win_size_avail_v;
    scroll_ratio._3_1_ = 0;
    scroll_ratio._2_1_ = 0;
    scroll_ratio._1_1_ = pIVar2->ActiveId == id_00;
    ButtonBehavior((ImRect *)local_60,id_00,(bool *)((long)&scroll_ratio + 2),
                   (bool *)((long)&scroll_ratio + 3),0x2000);
    fVar6 = ImMax<float>(1.0,grab_h_pixels - win_size_v);
    fVar7 = ImSaturate(win_size_contents_v / fVar6);
    mouse_pos_v = (fVar7 * (win_size_avail_v - fStack_84)) / win_size_avail_v;
    if (((scroll_ratio._3_1_ & 1) != 0) && (scroll_max < 1.0)) {
      if (bVar4) {
        fVar7 = (pIVar2->IO).MousePos.y;
        local_148 = (ImVec2 *)&(pIVar2->ScrollbarClickDeltaToGrabCenter).y;
        auVar1 = (undefined1  [4])window_rounding_corners;
      }
      else {
        fVar7 = (pIVar2->IO).MousePos.x;
        local_148 = &pIVar2->ScrollbarClickDeltaToGrabCenter;
        auVar1 = local_60;
      }
      fVar7 = ImSaturate((fVar7 - (float)auVar1) / win_size_avail_v);
      SetHoveredID(id_00);
      bVar5 = false;
      if ((scroll_ratio._1_1_ & 1) == 0) {
        if ((fVar7 < mouse_pos_v) || (mouse_pos_v + scroll_max < fVar7)) {
          bVar5 = true;
          local_148->x = 0.0;
        }
        else {
          local_148->x = -scroll_max * 0.5 + (fVar7 - mouse_pos_v);
        }
      }
      grab_rect.Max.y =
           ImSaturate((-scroll_max * 0.5 + (fVar7 - local_148->x)) / (1.0 - scroll_max));
      win_size_contents_v = (float)(int)(grab_rect.Max.y * fVar6 + 0.5);
      if (bVar4) {
        (this->Scroll).y = win_size_contents_v;
      }
      else {
        (this->Scroll).x = win_size_contents_v;
      }
      fVar6 = ImSaturate(win_size_contents_v / fVar6);
      mouse_pos_v = (fVar6 * (win_size_avail_v - fStack_84)) / win_size_avail_v;
      if (bVar5) {
        local_148->x = -scroll_max * 0.5 + (fVar7 - mouse_pos_v);
      }
    }
    if ((scroll_ratio._3_1_ & 1) == 0) {
      local_14c = 0xf;
      if ((scroll_ratio._2_1_ & 1) != 0) {
        local_14c = 0x10;
      }
    }
    else {
      local_14c = 0x11;
    }
    grab_rect.Max.x = (float)GetColorU32(local_14c,1.0);
    ImRect::ImRect((ImRect *)local_c8);
    if (bVar4) {
      fVar6 = ImLerp<float>((float)window_rounding_corners,bb.Min.y,mouse_pos_v);
      fVar7 = ImLerp<float>((float)window_rounding_corners,bb.Min.y,mouse_pos_v);
      fVar7 = ImMin<float>(fVar7 + fStack_84,window_rect.Min.y);
      ImRect::ImRect(&local_e8,(float)local_60,fVar6,bb.Min.x,fVar7);
      local_c8._0_4_ = local_e8.Min.x;
      local_c8._4_4_ = local_e8.Min.y;
      grab_rect.Min = local_e8.Max;
    }
    else {
      fVar6 = ImLerp<float>((float)local_60,bb.Min.x,mouse_pos_v);
      y1 = window_rounding_corners;
      fVar7 = ImLerp<float>((float)local_60,bb.Min.x,mouse_pos_v);
      fVar7 = ImMin<float>(fVar7 + fStack_84,window_rect.Min.x);
      ImRect::ImRect(&local_d8,fVar6,(float)y1,fVar7,bb.Min.y);
      local_c8._0_4_ = local_d8.Min.x;
      local_c8._4_4_ = local_d8.Min.y;
      grab_rect.Min = local_d8.Max;
    }
    ImDrawList::AddRectFilled
              (this->DrawList,(ImVec2 *)local_c8,&grab_rect.Min,(ImU32)grab_rect.Max.x,
               (pIVar2->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}